

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall
fasttext::ProductQuantizer::MStep
          (ProductQuantizer *this,real *x0,real *centroids,uint8_t *codes,int32_t d,int32_t n)

{
  real *prVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  byte bVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  real *prVar22;
  pointer piVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ushort uVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  vector<int,_std::allocator<int>_> nelts;
  allocator_type local_81;
  real *local_80;
  ulong local_78;
  long local_70;
  size_t local_68;
  long local_60;
  minstd_rand *local_58;
  value_type_conflict1 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)this->ksub_,&local_4c,&local_81);
  lVar19 = (long)d;
  local_80 = centroids;
  local_60 = lVar19;
  memset(centroids,0,(long)this->ksub_ * lVar19 * 4);
  if (0 < n) {
    uVar20 = 0;
    do {
      bVar2 = codes[uVar20];
      if (0 < d) {
        iVar24 = (uint)bVar2 * d;
        uVar25 = 0;
        do {
          local_80[(long)iVar24 + uVar25] = x0[uVar25] + local_80[(long)iVar24 + uVar25];
          uVar25 = uVar25 + 1;
        } while ((uint)d != uVar25);
      }
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[bVar2] =
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[bVar2] + 1;
      uVar20 = uVar20 + 1;
      x0 = x0 + lVar19;
    } while (uVar20 != (uint)n);
  }
  iVar24 = this->ksub_;
  uVar20 = (ulong)iVar24;
  piVar23 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (0 < (long)uVar20) {
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar30 = vpbroadcastq_avx512f();
    uVar25 = 0;
    prVar22 = local_80;
    do {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar25] != 0 && 0 < d) {
        auVar36._0_4_ =
             (float)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar25];
        auVar36._8_8_ = in_XMM6_Qb;
        auVar36._4_4_ = in_XMM6_Db;
        uVar26 = 0;
        auVar31 = vbroadcastss_avx512f(auVar36);
        do {
          auVar32 = vpbroadcastq_avx512f();
          auVar33 = vporq_avx512f(auVar32,auVar28);
          auVar32 = vporq_avx512f(auVar32,auVar29);
          uVar17 = vpcmpuq_avx512f(auVar32,auVar30,2);
          bVar2 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar33,auVar30,2);
          bVar18 = (byte)uVar17;
          uVar27 = CONCAT11(bVar18,bVar2);
          prVar1 = prVar22 + uVar26;
          auVar32._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * (int)prVar1[1];
          auVar32._0_4_ = (uint)(bVar2 & 1) * (int)*prVar1;
          auVar32._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * (int)prVar1[2];
          auVar32._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * (int)prVar1[3];
          auVar32._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * (int)prVar1[4];
          auVar32._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * (int)prVar1[5];
          auVar32._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * (int)prVar1[6];
          auVar32._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * (int)prVar1[7];
          auVar32._32_4_ = (uint)(bVar18 & 1) * (int)prVar1[8];
          auVar32._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)prVar1[9];
          auVar32._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)prVar1[10];
          auVar32._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)prVar1[0xb];
          auVar32._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)prVar1[0xc];
          auVar32._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)prVar1[0xd];
          auVar32._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)prVar1[0xe];
          auVar32._60_4_ = (uint)(bVar18 >> 7) * (int)prVar1[0xf];
          auVar32 = vdivps_avx512f(auVar32,auVar31);
          prVar1 = prVar22 + uVar26;
          bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar27 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar27 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar27 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar27 >> 6) & 1);
          bVar10 = (bool)((byte)(uVar27 >> 7) & 1);
          bVar11 = (bool)(bVar18 >> 1 & 1);
          bVar12 = (bool)(bVar18 >> 2 & 1);
          bVar13 = (bool)(bVar18 >> 3 & 1);
          bVar14 = (bool)(bVar18 >> 4 & 1);
          bVar15 = (bool)(bVar18 >> 5 & 1);
          bVar16 = (bool)(bVar18 >> 6 & 1);
          *prVar1 = (real)((uint)(bVar2 & 1) * auVar32._0_4_ |
                          (uint)!(bool)(bVar2 & 1) * (int)*prVar1);
          prVar1[1] = (real)((uint)bVar4 * auVar32._4_4_ | (uint)!bVar4 * (int)prVar1[1]);
          prVar1[2] = (real)((uint)bVar5 * auVar32._8_4_ | (uint)!bVar5 * (int)prVar1[2]);
          prVar1[3] = (real)((uint)bVar6 * auVar32._12_4_ | (uint)!bVar6 * (int)prVar1[3]);
          prVar1[4] = (real)((uint)bVar7 * auVar32._16_4_ | (uint)!bVar7 * (int)prVar1[4]);
          prVar1[5] = (real)((uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * (int)prVar1[5]);
          prVar1[6] = (real)((uint)bVar9 * auVar32._24_4_ | (uint)!bVar9 * (int)prVar1[6]);
          prVar1[7] = (real)((uint)bVar10 * auVar32._28_4_ | (uint)!bVar10 * (int)prVar1[7]);
          prVar1[8] = (real)((uint)(bVar18 & 1) * auVar32._32_4_ |
                            (uint)!(bool)(bVar18 & 1) * (int)prVar1[8]);
          prVar1[9] = (real)((uint)bVar11 * auVar32._36_4_ | (uint)!bVar11 * (int)prVar1[9]);
          prVar1[10] = (real)((uint)bVar12 * auVar32._40_4_ | (uint)!bVar12 * (int)prVar1[10]);
          prVar1[0xb] = (real)((uint)bVar13 * auVar32._44_4_ | (uint)!bVar13 * (int)prVar1[0xb]);
          prVar1[0xc] = (real)((uint)bVar14 * auVar32._48_4_ | (uint)!bVar14 * (int)prVar1[0xc]);
          prVar1[0xd] = (real)((uint)bVar15 * auVar32._52_4_ | (uint)!bVar15 * (int)prVar1[0xd]);
          prVar1[0xe] = (real)((uint)bVar16 * auVar32._56_4_ | (uint)!bVar16 * (int)prVar1[0xe]);
          prVar1[0xf] = (real)((uint)(bVar18 >> 7) * auVar32._60_4_ |
                              (uint)!(bool)(bVar18 >> 7) * (int)prVar1[0xf]);
          uVar26 = uVar26 + 0x10;
        } while ((d + 0xfU & 0xfffffff0) != uVar26);
      }
      uVar25 = uVar25 + 1;
      prVar22 = prVar22 + lVar19;
    } while (uVar25 != uVar20);
    if (0 < iVar24) {
      local_58 = &this->rng;
      lVar21 = 0;
      prVar22 = local_80;
      local_78 = (ulong)(uint)d;
      local_68 = lVar19 * 4;
      do {
        if (piVar23[lVar21] == 0) {
          iVar24 = 0;
          local_70 = lVar21;
          while( true ) {
            dVar34 = std::
                     generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                               (local_58);
            piVar23 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((dVar34 + 0.0) * (double)(n - this->ksub_) <
                (double)(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24] + -1)) break;
            iVar24 = (iVar24 + 1) % this->ksub_;
          }
          prVar1 = local_80 + iVar24 * (int)local_78;
          memcpy(local_80 + local_70 * local_60,prVar1,local_68);
          if (0 < (int)local_78) {
            lVar19 = 0;
            do {
              auVar35._0_4_ = (float)(int)(((uint)lVar19 & 2) - 1);
              auVar35._8_8_ = in_XMM6_Qb;
              auVar35._4_4_ = in_XMM6_Db;
              auVar36 = vfmadd213ss_fma(ZEXT416((uint)this->eps_),auVar35,
                                        ZEXT416(*(uint *)((long)prVar22 + lVar19 * 2)));
              *(int *)((long)prVar22 + lVar19 * 2) = auVar36._0_4_;
              auVar36 = vfnmadd213ss_fma(ZEXT416((uint)this->eps_),auVar35,
                                         ZEXT416(*(uint *)((long)prVar1 + lVar19 * 2)));
              *(int *)((long)prVar1 + lVar19 * 2) = auVar36._0_4_;
              lVar19 = lVar19 + 2;
            } while ((ulong)(uint)d * 2 != lVar19);
          }
          iVar3 = piVar23[iVar24];
          piVar23[local_70] = iVar3 / 2;
          piVar23[iVar24] = piVar23[iVar24] - iVar3 / 2;
          uVar20 = (ulong)(uint)this->ksub_;
          lVar21 = local_70;
        }
        prVar22 = (real *)((long)prVar22 + local_68);
        lVar21 = lVar21 + 1;
      } while (lVar21 < (int)uVar20);
      goto LAB_0012aef0;
    }
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    return;
  }
LAB_0012aef0:
  operator_delete(piVar23);
  return;
}

Assistant:

void ProductQuantizer::MStep(
    const real* x0,
    real* centroids,
    const uint8_t* codes,
    int32_t d,
    int32_t n) {
  std::vector<int32_t> nelts(ksub_, 0);
  memset(centroids, 0, sizeof(real) * d * ksub_);
  const real* x = x0;
  for (auto i = 0; i < n; i++) {
    auto k = codes[i];
    real* c = centroids + k * d;
    for (auto j = 0; j < d; j++) {
      c[j] += x[j];
    }
    nelts[k]++;
    x += d;
  }

  real* c = centroids;
  for (auto k = 0; k < ksub_; k++) {
    real z = (real)nelts[k];
    if (z != 0) {
      for (auto j = 0; j < d; j++) {
        c[j] /= z;
      }
    }
    c += d;
  }

  std::uniform_real_distribution<> runiform(0, 1);
  for (auto k = 0; k < ksub_; k++) {
    if (nelts[k] == 0) {
      int32_t m = 0;
      while (runiform(rng) * (n - ksub_) >= nelts[m] - 1) {
        m = (m + 1) % ksub_;
      }
      memcpy(centroids + k * d, centroids + m * d, sizeof(real) * d);
      for (auto j = 0; j < d; j++) {
        int32_t sign = (j % 2) * 2 - 1;
        centroids[k * d + j] += sign * eps_;
        centroids[m * d + j] -= sign * eps_;
      }
      nelts[k] = nelts[m] / 2;
      nelts[m] -= nelts[k];
    }
  }
}